

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndChild(void)

{
  ImGuiContext *pIVar1;
  ImVec2 *lhs;
  float fVar2;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImRect local_50;
  ImVec2 local_40;
  undefined1 local_38 [8];
  ImRect bb;
  ImGuiWindow *parent_window;
  ImVec2 sz;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  sz = (ImVec2)GImGui->CurrentWindow;
  if ((*(ImGuiWindowFlags *)((long)sz + 0xc) & 0x1000000U) == 0) {
    __assert_fail("window->Flags & ImGuiWindowFlags_ChildWindow",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/gui/imgui/imgui.cpp"
                  ,0x118e,"void ImGui::EndChild()");
  }
  if (*(short *)((long)sz + 0x88) < 2) {
    parent_window = *(ImGuiWindow **)((long)sz + 0x18);
    if ((*(int *)((long)sz + 0xa0) & 1U) != 0) {
      fVar2 = ImMax<float>(4.0,parent_window._0_4_);
      parent_window = (ImGuiWindow *)CONCAT44(parent_window._4_4_,fVar2);
    }
    if ((*(uint *)((long)sz + 0xa0) & 2) != 0) {
      fVar2 = ImMax<float>(4.0,parent_window._4_4_);
      parent_window = (ImGuiWindow *)CONCAT44(fVar2,parent_window._0_4_);
    }
    End();
    bb.Max = (ImVec2)pIVar1->CurrentWindow;
    lhs = (ImVec2 *)((long)bb.Max + 0xd0);
    local_40 = ::operator+(lhs,(ImVec2 *)&parent_window);
    ImRect::ImRect((ImRect *)local_38,lhs,&local_40);
    ItemSize((ImVec2 *)&parent_window,0.0);
    if (((*(int *)((long)sz + 0x140) == 0) && ((*(byte *)((long)sz + 0x149) & 1) == 0)) ||
       ((*(uint *)((long)sz + 0xc) & 0x800000) != 0)) {
      ItemAdd((ImRect *)local_38,0,(ImRect *)0x0);
    }
    else {
      ItemAdd((ImRect *)local_38,*(ImGuiID *)((long)sz + 0x58),(ImRect *)0x0);
      RenderNavHighlight((ImRect *)local_38,*(ImGuiID *)((long)sz + 0x58),1);
      if ((*(int *)((long)sz + 0x140) == 0) && (sz == (ImVec2)pIVar1->NavWindow)) {
        ImVec2::ImVec2(&local_60,2.0,2.0);
        local_58 = ::operator-((ImVec2 *)local_38,&local_60);
        ImVec2::ImVec2(&local_70,2.0,2.0);
        local_68 = ::operator+(&bb.Min,&local_70);
        ImRect::ImRect(&local_50,&local_58,&local_68);
        RenderNavHighlight(&local_50,pIVar1->NavId,2);
      }
    }
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::EndChild()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    IM_ASSERT(window->Flags & ImGuiWindowFlags_ChildWindow);   // Mismatched BeginChild()/EndChild() callss
    if (window->BeginCount > 1)
    {
        End();
    }
    else
    {
        ImVec2 sz = window->Size;
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_X)) // Arbitrary minimum zero-ish child size of 4.0f causes less trouble than a 0.0f
            sz.x = ImMax(4.0f, sz.x);
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_Y))
            sz.y = ImMax(4.0f, sz.y);
        End();

        ImGuiWindow* parent_window = g.CurrentWindow;
        ImRect bb(parent_window->DC.CursorPos, parent_window->DC.CursorPos + sz);
        ItemSize(sz);
        if ((window->DC.NavLayerActiveMask != 0 || window->DC.NavHasScroll) && !(window->Flags & ImGuiWindowFlags_NavFlattened))
        {
            ItemAdd(bb, window->ChildId);
            RenderNavHighlight(bb, window->ChildId);

            // When browsing a window that has no activable items (scroll only) we keep a highlight on the child
            if (window->DC.NavLayerActiveMask == 0 && window == g.NavWindow)
                RenderNavHighlight(ImRect(bb.Min - ImVec2(2,2), bb.Max + ImVec2(2,2)), g.NavId, ImGuiNavHighlightFlags_TypeThin);
        }
        else
        {
            // Not navigable into
            ItemAdd(bb, 0);
        }
    }
}